

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

LabelInstr * __thiscall IR::Instr::GetOrCreateContinueLabel(Instr *this,bool isHelper)

{
  Instr *this_00;
  LabelInstr *pLVar1;
  
  this_00 = this->m_next;
  if ((this_00 != (Instr *)0x0) &&
     ((this_00->m_kind == InstrKindProfiledLabel || (this_00->m_kind == InstrKindLabel)))) {
    pLVar1 = AsLabelInstr(this_00);
    if (((pLVar1->field_0x78 & 2) == 0) != isHelper) {
      pLVar1 = AsLabelInstr(this->m_next);
      return pLVar1;
    }
  }
  pLVar1 = LabelInstr::New(Label,this->m_func,isHelper);
  InsertAfter(this,&pLVar1->super_Instr);
  return pLVar1;
}

Assistant:

IR::LabelInstr *
Instr::GetOrCreateContinueLabel(const bool isHelper)
{
    if (m_next && m_next->IsLabelInstr() && m_next->AsLabelInstr()->isOpHelper == isHelper)
    {
        return m_next->AsLabelInstr();
    }

    IR::LabelInstr *const label = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
    InsertAfter(label);
    return label;
}